

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::DOM::TokenMatch(vector<char,_std::allocator<char>_> *buffer,char *token,uint len)

{
  char *this;
  bool bVar1;
  reference local_80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_70;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_68;
  const_iterator local_60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  const_iterator local_50;
  long local_48;
  uintptr_t iDiff;
  char *szCur;
  reference pvStack_30;
  bool ret;
  char *pCur;
  char *pcStack_20;
  uint len_local;
  char *token_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  pCur._4_4_ = len;
  pcStack_20 = token;
  token_local = (char *)buffer;
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (bVar1) {
    local_80 = (reference)0x0;
  }
  else {
    local_80 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)token_local,0);
  }
  pvStack_30 = local_80;
  szCur._7_1_ = 0;
  if (local_80 == (reference)0x0) {
    buffer_local._7_1_ = false;
  }
  else {
    iDiff = (uintptr_t)local_80;
    szCur._7_1_ = TokenMatch<char_const>(&stack0xffffffffffffffd0,pcStack_20,pCur._4_4_);
    this = token_local;
    local_48 = (long)pvStack_30 - iDiff;
    local_58._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(token_local);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_50,
               &local_58);
    local_70._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(token_local);
    local_68 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator+(&local_70,local_48);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_60,
               &local_68);
    std::vector<char,_std::allocator<char>_>::erase
              ((vector<char,_std::allocator<char>_> *)this,local_50,local_60);
    buffer_local._7_1_ = (bool)(szCur._7_1_ & 1);
  }
  return buffer_local._7_1_;
}

Assistant:

bool PLY::DOM::TokenMatch(std::vector<char> &buffer, const char* token, unsigned int len)
{
  const char* pCur = buffer.empty() ? NULL : (char*)&buffer[0];
  bool ret = false;
  if (pCur)
  {
    const char* szCur = pCur;
    ret = Assimp::TokenMatch(pCur, token, len);

    uintptr_t iDiff = (uintptr_t)pCur - (uintptr_t)szCur;
    buffer.erase(buffer.begin(), buffer.begin() + iDiff);
    return ret;
  }

  return ret;
}